

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void monty_import_into(MontyContext *mc,mp_int *r,mp_int *x)

{
  mp_int *x_00;
  ulong uVar1;
  
  x_00 = mp_modmul(x,mc->powers_of_r_mod_m[0],mc->m);
  uVar1 = x_00->nw;
  if (r->nw < x_00->nw) {
    uVar1 = r->nw;
  }
  memmove(r->w,x_00->w,uVar1 * 8);
  smemclr(r->w + uVar1,(r->nw - uVar1) * 8);
  mp_free(x_00);
  return;
}

Assistant:

void monty_import_into(MontyContext *mc, mp_int *r, mp_int *x)
{
    mp_int *imported = monty_import(mc, x);
    mp_copy_into(r, imported);
    mp_free(imported);
}